

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void tokenize(list *list,char *func)

{
  size_t sVar1;
  undefined8 local_20;
  size_t i;
  char *func_local;
  list *list_local;
  
  current_type = T_None;
  current_token = (char *)malloc_(1);
  *current_token = '\0';
  local_20 = 0;
  while( true ) {
    sVar1 = strlen(func);
    if (sVar1 < local_20) break;
    processChar(list,func,(int)local_20);
    local_20 = local_20 + 1;
  }
  sVar1 = strlen(current_token);
  if (sVar1 != 0) {
    addToken(list,current_token);
  }
  free(current_token);
  return;
}

Assistant:

void tokenize(struct list *list, const char *func)
{
    size_t i;

    current_type = T_None;
    current_token = malloc_(1);
    current_token[0] = '\0';

    for (i = 0; i <= strlen(func); i++) {
        processChar(list, func, i);
    }

    if (strlen(current_token) > 0) {
        addToken(list, current_token);
    }

    free(current_token);
}